

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_install.cpp
# Opt level: O2

unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
__thiscall
duckdb::ExtensionHelper::InstallExtensionInternal
          (ExtensionHelper *this,DatabaseInstance *db,FileSystem *fs,string *param_3,
          string *extension,ExtensionInstallOptions *options,
          optional_ptr<duckdb::HTTPLogger,_true> http_logger,
          optional_ptr<duckdb::ClientContext,_true> context)

{
  bool bVar1;
  int iVar2;
  ExtensionRepository *pEVar3;
  pointer pEVar4;
  PermissionException *this_00;
  InvalidInputException *pIVar5;
  hugeint_t hVar6;
  hugeint_t input;
  undefined8 uVar7;
  unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
  install_info;
  ExtensionRepository resolved_repository;
  optional_ptr<duckdb::ExtensionRepository,_true> local_1d8;
  string local_extension_path;
  string repo;
  string temp_path;
  string extension_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string custom_path;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((db->config).options.enable_external_access == false) {
    this_00 = (PermissionException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&resolved_repository,
               "Installing extensions is disabled through configuration",(allocator *)&repo);
    PermissionException::PermissionException(this_00,(string *)&resolved_repository);
    __cxa_throw(this_00,&PermissionException::typeinfo,::std::runtime_error::~runtime_error);
  }
  FileSystem::ExtractBaseName((string *)&resolved_repository,fs,(string *)extension);
  ApplyExtensionAlias(&extension_name,&resolved_repository.name);
  ::std::__cxx11::string::~string((string *)&resolved_repository);
  ::std::operator+(&resolved_repository.name,&extension_name,".duckdb_extension");
  pEVar3 = &resolved_repository;
  FileSystem::JoinPath((string *)&local_extension_path,fs,(string *)param_3,(string *)pEVar3);
  ::std::__cxx11::string::~string((string *)&resolved_repository);
  ::std::operator+(&resolved_repository.name,&local_extension_path,".tmp-");
  hVar6 = UUID::GenerateRandomUUID();
  input.lower = hVar6.upper;
  input.upper = (int64_t)pEVar3;
  BaseUUID::ToString_abi_cxx11_(&repo,(BaseUUID *)hVar6.lower,input);
  ::std::operator+(&temp_path,&resolved_repository.name,&repo);
  ::std::__cxx11::string::~string((string *)&repo);
  ::std::__cxx11::string::~string((string *)&resolved_repository);
  iVar2 = (*fs->_vptr_FileSystem[0x12])(fs,&local_extension_path,0);
  if (((char)iVar2 != '\0') && (options->force_install == false)) {
    if ((options->throw_on_origin_mismatch == true) &&
       ((db->config).options.allow_extensions_metadata_mismatch == false)) {
      ::std::operator+(&resolved_repository.name,&local_extension_path,".info");
      iVar2 = (*fs->_vptr_FileSystem[0x12])(fs,&resolved_repository,0);
      ::std::__cxx11::string::~string((string *)&resolved_repository);
      if ((char)iVar2 != '\0') {
        local_1d8.ptr = (options->repository).ptr;
        ::std::operator+(&resolved_repository.name,&local_extension_path,".info");
        ExtensionInstallInfo::TryReadInfoFile
                  ((ExtensionInstallInfo *)&install_info,fs,&resolved_repository.name,
                   &extension_name);
        ::std::__cxx11::string::~string((string *)&resolved_repository);
        ::std::__cxx11::string::string
                  ((string *)&resolved_repository,
                   "Installing extension \'%s\' failed. The extension is already installed but the origin is different.\nCurrently installed extension is from %s \'%s\', while the extension to be installed is from %s \'%s\'.\nTo solve this rerun this command with `FORCE INSTALL`"
                   ,(allocator *)&repo);
        ::std::__cxx11::string::string((string *)&repo,"repository",(allocator *)&custom_path);
        ::std::__cxx11::string::string((string *)&custom_path,"custom_path",(allocator *)&local_130)
        ;
        if (install_info.
            super_unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::ExtensionInstallInfo_*,_std::default_delete<duckdb::ExtensionInstallInfo>_>
            .super__Head_base<0UL,_duckdb::ExtensionInstallInfo_*,_false>._M_head_impl !=
            (__uniq_ptr_data<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true,_true>
             )0x0) {
          pEVar4 = unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
                   ::operator->(&install_info);
          if ((pEVar4->mode == REPOSITORY) && (local_1d8.ptr != (ExtensionRepository *)0x0)) {
            pEVar4 = unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
                     ::operator->(&install_info);
            pEVar3 = optional_ptr<duckdb::ExtensionRepository,_true>::operator->(&local_1d8);
            bVar1 = ::std::operator!=(&pEVar4->repository_url,&pEVar3->path);
            if (bVar1) {
              pIVar5 = (InvalidInputException *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string((string *)&local_130,(string *)&extension_name);
              ::std::__cxx11::string::string((string *)&local_d0,(string *)&repo);
              pEVar4 = unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
                       ::operator->(&install_info);
              ::std::__cxx11::string::string((string *)&local_f0,(string *)&pEVar4->repository_url);
              ::std::__cxx11::string::string((string *)&local_110,(string *)&repo);
              pEVar3 = optional_ptr<duckdb::ExtensionRepository,_true>::operator->(&local_1d8);
              uVar7 = 0x198055b;
              ::std::__cxx11::string::string((string *)&local_50,(string *)&pEVar3->path);
              InvalidInputException::
              InvalidInputException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                        (pIVar5,&resolved_repository.name,&local_130,&local_d0,&local_f0,&local_110,
                         &local_50);
              __cxa_throw(pIVar5,&InvalidInputException::typeinfo,
                          ::std::runtime_error::~runtime_error,uVar7);
            }
          }
          pEVar4 = unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
                   ::operator->(&install_info);
          if (pEVar4->mode == REPOSITORY) {
            bVar1 = IsFullPath(extension);
            if (bVar1) {
              pIVar5 = (InvalidInputException *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string((string *)&local_130,(string *)&extension_name);
              ::std::__cxx11::string::string((string *)&local_d0,(string *)&repo);
              pEVar4 = unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
                       ::operator->(&install_info);
              ::std::__cxx11::string::string((string *)&local_f0,(string *)&pEVar4->repository_url);
              ::std::__cxx11::string::string((string *)&local_110,(string *)&custom_path);
              uVar7 = 0x1980625;
              ::std::__cxx11::string::string((string *)&local_50,(string *)extension);
              InvalidInputException::
              InvalidInputException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                        (pIVar5,&resolved_repository.name,&local_130,&local_d0,&local_f0,&local_110,
                         &local_50);
              __cxa_throw(pIVar5,&InvalidInputException::typeinfo,
                          ::std::runtime_error::~runtime_error,uVar7);
            }
          }
        }
        ::std::__cxx11::string::~string((string *)&custom_path);
        ::std::__cxx11::string::~string((string *)&repo);
        ::std::__cxx11::string::~string((string *)&resolved_repository);
        ::std::
        unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
        ::~unique_ptr(&install_info.
                       super_unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
                     );
      }
    }
    *(undefined8 *)this = 0;
    goto LAB_0198040b;
  }
  iVar2 = (*fs->_vptr_FileSystem[0x12])(fs,&temp_path,0);
  if ((char)iVar2 != '\0') {
    (*fs->_vptr_FileSystem[0x14])(fs,&temp_path,0);
  }
  bVar1 = IsFullPath(extension);
  if (bVar1 && (options->repository).ptr != (ExtensionRepository *)0x0) {
    pIVar5 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&resolved_repository,"Cannot pass both a repository and a full path url",
               (allocator *)&repo);
    InvalidInputException::InvalidInputException(pIVar5,(string *)&resolved_repository);
    __cxa_throw(pIVar5,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ExtensionRepository::ExtensionRepository(&resolved_repository);
  bVar1 = IsFullPath(extension);
  if (!bVar1 && (options->repository).ptr == (ExtensionRepository *)0x0) {
    ExtensionRepository::GetDefaultRepository
              ((optional_ptr<duckdb::DBConfig,_true>)
               install_info.
               super_unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ExtensionInstallInfo_*,_std::default_delete<duckdb::ExtensionInstallInfo>_>
               .super__Head_base<0UL,_duckdb::ExtensionInstallInfo_*,_false>._M_head_impl);
    ExtensionRepository::operator=(&resolved_repository,(ExtensionRepository *)&repo);
    ExtensionRepository::~ExtensionRepository((ExtensionRepository *)&repo);
    (options->repository).ptr = &resolved_repository;
  }
  bVar1 = IsFullPath(extension);
  if (bVar1) {
    bVar1 = IsHTTP(extension);
    if (bVar1) goto LAB_019800b5;
    repo._M_dataplus._M_p = (pointer)&PTR__FileSystem_027aca08;
    DirectInstallExtension
              ((duckdb *)this,db,(FileSystem *)&repo,extension,&temp_path,extension,
               &local_extension_path,options,context);
LAB_019803c6:
    FileSystem::~FileSystem((FileSystem *)&repo);
  }
  else {
LAB_019800b5:
    if ((options->repository).ptr != (ExtensionRepository *)0x0) {
      pEVar3 = optional_ptr<duckdb::ExtensionRepository,_true>::operator->(&options->repository);
      bVar1 = IsHTTP(&pEVar3->path);
      if (!bVar1) {
        repo._M_dataplus._M_p = (pointer)&PTR__FileSystem_027aca08;
        InstallFromRepository
                  ((DatabaseInstance *)this,(FileSystem *)db,(string *)fs,&extension_name,&temp_path
                   ,&local_extension_path,options,http_logger,context);
        goto LAB_019803c6;
      }
    }
    bVar1 = IsFullPath(extension);
    if (bVar1) {
      ::std::__cxx11::string::string((string *)&local_70,(string *)extension);
      ::std::__cxx11::string::string((string *)&local_90,"http://",(allocator *)&repo);
      bVar1 = StringUtil::StartsWith(&local_70,&local_90);
      ::std::__cxx11::string::~string((string *)&local_90);
      ::std::__cxx11::string::~string((string *)&local_70);
      if (bVar1) {
        InstallFromHttpUrl((duckdb *)this,db,extension,&extension_name,&temp_path,
                           &local_extension_path,options,http_logger);
      }
      else {
        DirectInstallExtension
                  ((duckdb *)this,db,fs,extension,&temp_path,extension,&local_extension_path,options
                   ,context);
      }
    }
    else {
      InstallFromRepository
                ((DatabaseInstance *)this,(FileSystem *)db,(string *)fs,&extension_name,&temp_path,
                 &local_extension_path,options,http_logger,context);
    }
  }
  ExtensionRepository::~ExtensionRepository(&resolved_repository);
LAB_0198040b:
  ::std::__cxx11::string::~string((string *)&temp_path);
  ::std::__cxx11::string::~string((string *)&local_extension_path);
  ::std::__cxx11::string::~string((string *)&extension_name);
  return (unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
          )(unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
            )this;
}

Assistant:

unique_ptr<ExtensionInstallInfo>
ExtensionHelper::InstallExtensionInternal(DatabaseInstance &db, FileSystem &fs, const string &local_path,
                                          const string &extension, ExtensionInstallOptions &options,
                                          optional_ptr<HTTPLogger> http_logger, optional_ptr<ClientContext> context) {
#ifdef DUCKDB_DISABLE_EXTENSION_LOAD
	throw PermissionException("Installing external extensions is disabled through a compile time flag");
#else
	if (!db.config.options.enable_external_access) {
		throw PermissionException("Installing extensions is disabled through configuration");
	}

	auto extension_name = ApplyExtensionAlias(fs.ExtractBaseName(extension));
	string local_extension_path = fs.JoinPath(local_path, extension_name + ".duckdb_extension");
	string temp_path = local_extension_path + ".tmp-" + UUID::ToString(UUID::GenerateRandomUUID());

	if (fs.FileExists(local_extension_path) && !options.force_install) {
		// File exists: throw error if origin mismatches
		if (options.throw_on_origin_mismatch && !db.config.options.allow_extensions_metadata_mismatch &&
		    fs.FileExists(local_extension_path + ".info")) {
			ThrowErrorOnMismatchingExtensionOrigin(fs, local_extension_path, extension_name, extension,
			                                       options.repository);
		}

		// File exists, but that's okay, install is now a NOP
		return nullptr;
	}

	if (fs.FileExists(temp_path)) {
		fs.RemoveFile(temp_path);
	}

	if (ExtensionHelper::IsFullPath(extension) && options.repository) {
		throw InvalidInputException("Cannot pass both a repository and a full path url");
	}

	// Resolve default repository if there is none set
	ExtensionRepository resolved_repository;
	if (!ExtensionHelper::IsFullPath(extension) && !options.repository) {
		resolved_repository = ExtensionRepository::GetDefaultRepository(db.config);
		options.repository = resolved_repository;
	}

	// Install extension from local, direct url
	if (ExtensionHelper::IsFullPath(extension) && !IsHTTP(extension)) {
		LocalFileSystem local_fs;
		return DirectInstallExtension(db, local_fs, extension, temp_path, extension, local_extension_path, options,
		                              context);
	}

	// Install extension from local url based on a repository (Note that this will install it as a local file)
	if (options.repository && !IsHTTP(options.repository->path)) {
		LocalFileSystem local_fs;
		return InstallFromRepository(db, fs, extension, extension_name, temp_path, local_extension_path, options,
		                             http_logger, context);
	}

#ifdef DISABLE_DUCKDB_REMOTE_INSTALL
	throw BinderException("Remote extension installation is disabled through configuration");
#else

	// Full path direct installation
	if (IsFullPath(extension)) {
		if (StringUtil::StartsWith(extension, "http://")) {
			// HTTP takes separate path to avoid dependency on httpfs extension
			return InstallFromHttpUrl(db, extension, extension_name, temp_path, local_extension_path, options,
			                          http_logger);
		}

		// Direct installation from local or remote path
		return DirectInstallExtension(db, fs, extension, temp_path, extension, local_extension_path, options, context);
	}

	// Repository installation
	return InstallFromRepository(db, fs, extension, extension_name, temp_path, local_extension_path, options,
	                             http_logger, context);
#endif
#endif
}